

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O1

uint32_t helper_neon_cls_s32_arm(uint32_t x)

{
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  
  uVar2 = 0x1f;
  if ((int)x >> 0x1f != x) {
    uVar3 = (int)x >> 0x1f ^ x;
    do {
      uVar2 = uVar2 - 1;
      bVar1 = 1 < uVar3;
      uVar3 = uVar3 >> 1;
    } while (bVar1);
  }
  return uVar2;
}

Assistant:

uint32_t HELPER(neon_cls_s32)(uint32_t x)
{
    int count;
    if ((int32_t)x < 0)
        x = ~x;
    for (count = 32; x; count--)
        x = x >> 1;
    return count - 1;
}